

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.cpp
# Opt level: O3

string * __thiscall
helics::fileops::getName_abi_cxx11_(string *__return_storage_ptr__,fileops *this,value *element)

{
  pointer pcVar1;
  enable_if_t<detail::is_exact_toml_type<basic_string<char>,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<basic_string<char,_char_traits<char>,_allocator<char>_>_>_&>
  pbVar2;
  
  pbVar2 = toml::find_or<std::__cxx11::string,toml::type_config,char[4]>
                     ((basic_value<toml::type_config> *)this,(char (*) [4])0x455ec2,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      emptyString_abi_cxx11_);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (pbVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pbVar2->_M_string_length);
  if (__return_storage_ptr__->_M_string_length == 0) {
    pbVar2 = toml::find_or<std::__cxx11::string,toml::type_config,char[5]>
                       ((basic_value<toml::type_config> *)this,(char (*) [5])0x43fbf7,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        emptyString_abi_cxx11_);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getName(const toml::value& element)
{
    std::string retval = toml::find_or(element, "key", emptyString);
    if (retval.empty()) {
        retval = toml::find_or(element, "name", emptyString);
    }
    return retval;
}